

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::visitIf(BinaryInstWriter *this,If *curr)

{
  std::vector<wasm::Name,std::allocator<wasm::Name>>::emplace_back<wasm::Name&>
            ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->breakStack,
             (Name *)IMPOSSIBLE_CONTINUE);
  BufferWithRandomAccess::operator<<(this->o,'\x04');
  emitResultType(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)2>).
                            super_Expression.type.id);
  return;
}

Assistant:

void BinaryInstWriter::visitIf(If* curr) {
  // the binary format requires this; we have a block if we need one
  // TODO: optimize this in Stack IR (if child is a block, we may break to this
  // instead)
  breakStack.emplace_back(IMPOSSIBLE_CONTINUE);
  o << int8_t(BinaryConsts::If);
  emitResultType(curr->type);
}